

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_iTXt(ucvector *out,uint compress,char *keyword,char *langtag,char *transkey,
                  char *textstring,LodePNGCompressSettings *zlibsettings)

{
  long lVar1;
  uchar *__src;
  uchar *chunk_00;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char *orig_2;
  size_t __n;
  long lVar7;
  int iVar9;
  size_t sVar10;
  size_t compressedsize;
  uchar *compressed;
  uchar *chunk;
  size_t local_78;
  uchar *local_70;
  uchar *local_68;
  uchar *local_60;
  size_t local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  size_t local_38;
  long lVar8;
  
  local_68 = (uchar *)0x0;
  local_70 = (uchar *)0x0;
  local_78 = 0;
  local_58 = 0xffffffffffffffff;
  do {
    lVar7 = local_58 + 1;
    local_58 = local_58 + 1;
  } while (textstring[lVar7] != '\0');
  sVar10 = 0;
  do {
    sVar6 = sVar10;
    sVar10 = sVar6 + 1;
  } while (keyword[sVar6] != '\0');
  iVar9 = -2 - (int)(sVar6 + 1);
  sVar10 = 0xffffffffffffffff;
  lVar7 = sVar6 + 0xb;
  do {
    lVar8 = lVar7;
    lVar7 = lVar8 + 1;
    iVar9 = iVar9 + -1;
    lVar5 = sVar10 + 1;
    sVar10 = sVar10 + 1;
  } while (langtag[lVar5] != '\0');
  __n = 0xffffffffffffffff;
  lVar5 = lVar7;
  do {
    lVar4 = lVar5;
    iVar9 = iVar9 + -1;
    lVar5 = lVar4 + 1;
    lVar1 = __n + 1;
    __n = __n + 1;
  } while (transkey[lVar1] != '\0');
  if (sVar6 - 0x50 < 0xffffffffffffffb1) {
    return 0x59;
  }
  iVar3 = (int)local_58;
  local_60 = (uchar *)textstring;
  local_50 = langtag;
  local_48 = transkey;
  local_40 = keyword;
  local_38 = sVar6;
  if (compress != 0) {
    if (zlibsettings->custom_zlib ==
        (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
      uVar2 = lodepng_zlib_compress(&local_70,&local_78,(uchar *)textstring,local_58,zlibsettings);
    }
    else {
      uVar2 = (*zlibsettings->custom_zlib)
                        (&local_70,&local_78,(uchar *)textstring,local_58,zlibsettings);
    }
    if (uVar2 != 0) goto LAB_0012421e;
    iVar3 = (int)local_78;
  }
  uVar2 = lodepng_chunk_init(&local_68,out,iVar3 - iVar9,"iTXt");
  chunk_00 = local_68;
  if (uVar2 == 0) {
    memcpy(local_68 + 8,local_40,local_38);
    chunk_00[sVar6 + 8] = '\0';
    chunk_00[sVar6 + 9] = compress != 0;
    chunk_00[sVar6 + 10] = '\0';
    if (sVar10 != 0) {
      memcpy(chunk_00 + sVar6 + 0xb,local_50,sVar10);
    }
    chunk_00[lVar8] = '\0';
    if (__n != 0) {
      memcpy(chunk_00 + lVar7,local_48,__n);
    }
    chunk_00[lVar4] = '\0';
    __src = local_60;
    sVar10 = local_58;
    if (compress != 0) {
      __src = local_70;
      sVar10 = local_78;
    }
    if (sVar10 != 0) {
      memcpy(chunk_00 + lVar5,__src,sVar10);
    }
    lodepng_chunk_generate_crc(chunk_00);
    uVar2 = 0;
  }
LAB_0012421e:
  free(local_70);
  return uVar2;
}

Assistant:

static unsigned addChunk_iTXt(ucvector* out, unsigned compress, const char* keyword, const char* langtag,
                              const char* transkey, const char* textstring, LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* chunk = 0;
  unsigned char* compressed = 0;
  size_t compressedsize = 0;
  size_t textsize = lodepng_strlen(textstring);
  size_t keysize = lodepng_strlen(keyword), langsize = lodepng_strlen(langtag), transsize = lodepng_strlen(transkey);

  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/

  if(compress) {
    error = zlib_compress(&compressed, &compressedsize,
                          (const unsigned char*)textstring, textsize, zlibsettings);
  }
  if(!error) {
    size_t size = keysize + 3 + langsize + 1 + transsize + 1 + (compress ? compressedsize : textsize);
    error = lodepng_chunk_init(&chunk, out, size, "iTXt");
  }
  if(!error) {
    size_t pos = 8;
    lodepng_memcpy(chunk + pos, keyword, keysize);
    pos += keysize;
    chunk[pos++] = 0; /*null termination char*/
    chunk[pos++] = (compress ? 1 : 0); /*compression flag*/
    chunk[pos++] = 0; /*compression method: 0*/
    lodepng_memcpy(chunk + pos, langtag, langsize);
    pos += langsize;
    chunk[pos++] = 0; /*null termination char*/
    lodepng_memcpy(chunk + pos, transkey, transsize);
    pos += transsize;
    chunk[pos++] = 0; /*null termination char*/
    if(compress) {
      lodepng_memcpy(chunk + pos, compressed, compressedsize);
    } else {
      lodepng_memcpy(chunk + pos, textstring, textsize);
    }
    lodepng_chunk_generate_crc(chunk);
  }

  lodepng_free(compressed);
  return error;
}